

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

void __thiscall
GlobOptBlockData::KillStateForGeneratorYield(GlobOptBlockData *this,Instr *yieldInstr)

{
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            (this->liveInt32Syms,this->liveVarSyms);
  GlobOpt::ToVar(this->globOpt,this->liveInt32Syms,this->globOpt->currentBlock,yieldInstr);
  BVSparse<Memory::JitArenaAllocator>::ClearAll(this->liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            (this->liveFloat64Syms,this->liveVarSyms);
  GlobOpt::ToVar(this->globOpt,this->liveFloat64Syms,this->globOpt->currentBlock,yieldInstr);
  BVSparse<Memory::JitArenaAllocator>::ClearAll(this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::ClearAll(this->liveLossyInt32Syms);
  this->hasCSECandidates = false;
  ValueHashTable<ExprHash,_Value_*>::ClearAll(this->exprToValueMap);
  KillSymToValueMapForGeneratorYield(this);
  return;
}

Assistant:

void
GlobOptBlockData::KillStateForGeneratorYield(IR::Instr* yieldInstr)
{
    this->liveInt32Syms->Minus(this->liveVarSyms);
    this->globOpt->ToVar(liveInt32Syms, this->globOpt->currentBlock, yieldInstr /* insertBeforeInstr */);
    this->liveInt32Syms->ClearAll();

    this->liveFloat64Syms->Minus(this->liveVarSyms);
    this->globOpt->ToVar(liveFloat64Syms, this->globOpt->currentBlock, yieldInstr /* insertBeforeInstr */);
    this->liveFloat64Syms->ClearAll();

    this->liveLossyInt32Syms->ClearAll();
    // Keep this->liveVarSyms as is
    // Keep this->argObjSyms as is

    this->hasCSECandidates = false;

    // No need to clear `isTempSrc` (used for in-place string concat)

    this->exprToValueMap->ClearAll();

    this->KillSymToValueMapForGeneratorYield();
}